

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_base.hpp
# Opt level: O2

void __thiscall oqpi::worker_base::~worker_base(worker_base *this)

{
  this->_vptr_worker_base = (_func_int **)&PTR__worker_base_00214e60;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->hTask_).spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&this->config_);
  return;
}

Assistant:

virtual ~worker_base()
        {}